

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TransformFeedback::ProgramSpec::~ProgramSpec(ProgramSpec *this)

{
  StructType *this_00;
  bool bVar1;
  reference ppSVar2;
  __normal_iterator<glu::StructType_**,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
  local_20;
  __normal_iterator<glu::StructType_**,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
  local_18;
  iterator i;
  ProgramSpec *this_local;
  
  i._M_current = (StructType **)this;
  local_18._M_current =
       (StructType **)
       std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::begin(&this->m_structs);
  while( true ) {
    local_20._M_current =
         (StructType **)
         std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::end(&this->m_structs);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<glu::StructType_**,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppSVar2;
    if (this_00 != (StructType *)0x0) {
      glu::StructType::~StructType(this_00);
      operator_delete(this_00,0x38);
    }
    __gnu_cxx::
    __normal_iterator<glu::StructType_**,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
    ::operator++(&local_18,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_transformFeedbackVaryings);
  std::
  vector<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
  ::~vector(&this->m_varyings);
  std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::~vector(&this->m_structs);
  return;
}

Assistant:

ProgramSpec::~ProgramSpec (void)
{
	for (vector<glu::StructType*>::iterator i = m_structs.begin(); i != m_structs.end(); i++)
		delete *i;
}